

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O0

bool caffe::NetNeedsBatchNormUpgrade(NetParameter *net_param)

{
  bool bVar1;
  int iVar2;
  LayerParameter *pLVar3;
  string *__lhs;
  int local_1c;
  int i;
  NetParameter *net_param_local;
  
  local_1c = 0;
  do {
    iVar2 = NetParameter::layer_size(net_param);
    if (iVar2 <= local_1c) {
      return false;
    }
    pLVar3 = NetParameter::layer(net_param,local_1c);
    __lhs = LayerParameter::type_abi_cxx11_(pLVar3);
    bVar1 = std::operator==(__lhs,"BatchNorm");
    if (bVar1) {
      pLVar3 = NetParameter::layer(net_param,local_1c);
      iVar2 = LayerParameter::param_size(pLVar3);
      if (iVar2 == 3) {
        return true;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool NetNeedsBatchNormUpgrade(const NetParameter& net_param) {
  for (int i = 0; i < net_param.layer_size(); ++i) {
    // Check if BatchNorm layers declare three parameters, as required by
    // the previous BatchNorm layer definition.
    if (net_param.layer(i).type() == "BatchNorm"
        && net_param.layer(i).param_size() == 3) {
      return true;
    }
  }
  return false;
}